

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser.cc
# Opt level: O1

bool __thiscall ManifestParser::ParseDefault(ManifestParser *this,string *err)

{
  long *plVar1;
  StringPiece path_00;
  pointer ppVar2;
  pointer ppVar3;
  bool bVar4;
  Lexer *this_00;
  byte unaff_BPL;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  pointer ppVar6;
  EvalString eval;
  string path;
  string path_err;
  uint64_t slash_bits;
  EvalString local_a8;
  string local_88;
  string local_68;
  string *local_48;
  Lexer *local_40;
  uint64_t local_38;
  
  local_a8.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &(this->super_Parser).lexer_;
  bVar4 = Lexer::ReadEvalString(this_00,&local_a8,true,err);
  if (bVar4) {
    if (local_a8.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        local_a8.parsed_.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"expected target name","")
      ;
      unaff_BPL = Lexer::Error(this_00,&local_88,err);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_48 = err;
      local_40 = this_00;
      do {
        EvalString::Evaluate_abi_cxx11_(&local_88,&local_a8,&this->env_->super_Env);
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        local_68._M_string_length = 0;
        local_68.field_2._M_local_buf[0] = '\0';
        bVar4 = CanonicalizePath(&local_88,&local_38,&local_68);
        if (bVar4) {
          path_00.len_ = local_88._M_string_length;
          path_00.str_ = local_88._M_dataplus._M_p;
          bVar4 = State::AddDefault((this->super_Parser).state_,path_00,&local_68);
          ppVar3 = local_a8.parsed_.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          ppVar2 = local_a8.parsed_.
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (!bVar4) goto LAB_00119612;
          if (local_a8.parsed_.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_a8.parsed_.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            paVar5 = &((local_a8.parsed_.
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->first).field_2;
            do {
              plVar1 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)(paVar5 + -1))->_M_dataplus)._M_p;
              if (paVar5 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)plVar1) {
                operator_delete(plVar1,paVar5->_M_allocated_capacity + 1);
              }
              ppVar6 = (pointer)((long)paVar5 + 0x18);
              paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)((long)paVar5 + 0x28);
            } while (ppVar6 != ppVar3);
            local_a8.parsed_.
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
            err = local_48;
          }
          this_00 = local_40;
          bVar4 = Lexer::ReadEvalString(local_40,&local_a8,true,err);
          unaff_BPL = unaff_BPL & bVar4;
        }
        else {
LAB_00119612:
          unaff_BPL = Lexer::Error(this_00,&local_68,err);
          bVar4 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,
                          CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                                   local_68.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
        }
        if (bVar4 == false) goto LAB_0011968c;
      } while (local_a8.parsed_.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               local_a8.parsed_.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
      unaff_BPL = Parser::ExpectToken(&this->super_Parser,NEWLINE,err);
    }
  }
  else {
    unaff_BPL = false;
  }
LAB_0011968c:
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::~vector(&local_a8.parsed_);
  return (bool)unaff_BPL;
}

Assistant:

bool ManifestParser::ParseDefault(string* err) {
  EvalString eval;
  if (!lexer_.ReadPath(&eval, err))
    return false;
  if (eval.empty())
    return lexer_.Error("expected target name", err);

  do {
    string path = eval.Evaluate(env_);
    string path_err;
    uint64_t slash_bits;  // Unused because this only does lookup.
    if (!CanonicalizePath(&path, &slash_bits, &path_err))
      return lexer_.Error(path_err, err);
    if (!state_->AddDefault(path, &path_err))
      return lexer_.Error(path_err, err);

    eval.Clear();
    if (!lexer_.ReadPath(&eval, err))
      return false;
  } while (!eval.empty());

  if (!ExpectToken(Lexer::NEWLINE, err))
    return false;

  return true;
}